

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.cpp
# Opt level: O3

void __thiscall Args_ErrorMissingValueEqual_Test::TestBody(Args_ErrorMissingValueEqual_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  bool errCalled;
  AssertionResult gtest_ar_;
  int nthreads;
  AssertionResult gtest_ar;
  char **argv;
  char local_a1;
  AssertHelper local_a0;
  Message local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88;
  int local_7c;
  string local_78;
  char **local_58;
  string local_50;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_a1 = '\0';
  local_7c = 2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--nthreads=","");
  local_58 = makeArgs(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"nthreads","");
  local_30._M_unused._M_object = &local_a1;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/args_test.cpp:109:21)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/args_test.cpp:109:21)>
             ::_M_manager;
  bVar2 = pbrt::ParseArg<int*>
                    (&local_58,&local_78,&local_7c,
                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)&local_30);
  local_98.ss_.ptr_._0_4_ = CONCAT31(local_98.ss_.ptr_._1_3_,!bVar2);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_98.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)&local_98,
               (AssertionResult *)"ParseArg(&argv, \"nthreads\", &nthreads, callback)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/args_test.cpp"
               ,0x71,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.ss_.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_78,"nthreads","2",&local_7c,(int *)&local_98);
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_98);
    if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_78._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/args_test.cpp"
               ,0x72,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.ss_.ptr_._0_4_ = CONCAT31(local_98.ss_.ptr_._1_3_,local_a1);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a1 == '\0') {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)&local_98,(AssertionResult *)"errCalled","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/args_test.cpp"
               ,0x73,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Args, ErrorMissingValueEqual) {
    bool errCalled = false;
    auto callback = [&errCalled](const std::string &s) { errCalled = true; };

    int nthreads = 2;
    auto argv = makeArgs("--nthreads=");
    EXPECT_FALSE(ParseArg(&argv, "nthreads", &nthreads, callback));
    EXPECT_EQ(nthreads, 2);
    EXPECT_TRUE(errCalled);
}